

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> __thiscall
cmDyndepCollation::ParseExportInfo(cmDyndepCollation *this,Value *tdi)

{
  bool bVar1;
  cmFileSetVisibility cVar2;
  cmCxxModuleExportInfo *this_00;
  Value *pVVar3;
  pointer pcVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  const_iterator cVar8;
  string_view name;
  String local_4e0;
  Value *local_4c0;
  Value *tdi_fs_dest;
  string_view local_498;
  String local_488;
  String local_468;
  char local_441;
  string local_440;
  String local_420;
  String local_400;
  reference local_3e0;
  Value *tdi_cxx_module_info;
  String local_3b0;
  mapped_type *local_390;
  CxxModuleFileSet *fsi;
  undefined1 local_380;
  SelfType local_378;
  _Base_ptr local_368;
  undefined1 local_360;
  undefined1 local_358 [8];
  const_iterator i;
  Value *tdi_cxx_modules;
  String local_320;
  String local_300;
  String local_2e0;
  String local_2c0;
  undefined1 local_2a0 [8];
  CxxModuleBmiInstall bmi_install;
  Value *bmi_installation;
  String local_1d0;
  String local_1b0;
  String local_190;
  String local_170;
  undefined1 local_150 [8];
  CxxModuleExport exp;
  Value *tdi_export;
  undefined1 local_90 [8];
  const_iterator __end2;
  undefined1 local_70 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *tdi_exports;
  String local_40;
  undefined1 local_19;
  Value *local_18;
  Value *tdi_local;
  unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *export_info;
  
  local_19 = 0;
  local_18 = tdi;
  tdi_local = (Value *)this;
  this_00 = (cmCxxModuleExportInfo *)operator_new(0x118);
  cmCxxModuleExportInfo::cmCxxModuleExportInfo(this_00);
  std::unique_ptr<cmCxxModuleExportInfo,cmCxxModuleExportInfoDeleter>::
  unique_ptr<cmCxxModuleExportInfoDeleter,void>
            ((unique_ptr<cmCxxModuleExportInfo,cmCxxModuleExportInfoDeleter> *)this,this_00);
  pVVar3 = Json::Value::operator[](local_18,"config");
  Json::Value::asString_abi_cxx11_(&local_40,pVVar3);
  pcVar4 = std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
                     ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
  std::__cxx11::string::operator=((string *)&pcVar4->Config,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
            ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    pcVar4 = std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
                       ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
    std::__cxx11::string::operator=((string *)&pcVar4->Config,"noconfig");
  }
  pVVar3 = Json::Value::operator[](local_18,"exports");
  bVar1 = Json::Value::isArray(pVVar3);
  if (bVar1) {
    __begin2.super_ValueIteratorBase._8_8_ = pVVar3;
    cVar8 = Json::Value::begin(pVVar3);
    __end2.super_ValueIteratorBase._8_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
    __begin2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar8.super_ValueIteratorBase.isNull_;
    local_70 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
    cVar8 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
    local_90 = (undefined1  [8])cVar8.super_ValueIteratorBase.current_._M_node;
    __end2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar8.super_ValueIteratorBase.isNull_;
    while (bVar1 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)local_70,(SelfType *)local_90), bVar1) {
      exp._160_8_ = Json::ValueConstIterator::operator*((ValueConstIterator *)local_70);
      CxxModuleExport::CxxModuleExport((CxxModuleExport *)local_150);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"install");
      exp.Namespace.field_2._M_local_buf[8] = Json::Value::asBool(pVVar3);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"export-name");
      Json::Value::asString_abi_cxx11_(&local_170,pVVar3);
      std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"destination");
      Json::Value::asString_abi_cxx11_(&local_190,pVVar3);
      std::__cxx11::string::operator=
                ((string *)(exp.Name.field_2._M_local_buf + 8),(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"export-prefix");
      Json::Value::asString_abi_cxx11_(&local_1b0,pVVar3);
      std::__cxx11::string::operator=
                ((string *)(exp.Destination.field_2._M_local_buf + 8),(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"cxx-module-info-dir");
      Json::Value::asString_abi_cxx11_(&local_1d0,pVVar3);
      std::__cxx11::string::operator=
                ((string *)(exp.Prefix.field_2._M_local_buf + 8),(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      pVVar3 = Json::Value::operator[]((Value *)exp._160_8_,"namespace");
      Json::Value::asString_abi_cxx11_((String *)&bmi_installation,pVVar3);
      std::__cxx11::string::operator=
                ((string *)(exp.CxxModuleInfoDir.field_2._M_local_buf + 8),
                 (string *)&bmi_installation);
      std::__cxx11::string::~string((string *)&bmi_installation);
      pcVar4 = std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
                         ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
      std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                (&pcVar4->Exports,(value_type *)local_150);
      CxxModuleExport::~CxxModuleExport((CxxModuleExport *)local_150);
      Json::ValueConstIterator::operator++((ValueConstIterator *)local_70);
    }
  }
  bmi_install.ScriptLocation.field_2._8_8_ = Json::Value::operator[](local_18,"bmi-installation");
  bVar1 = Json::Value::isObject((Value *)bmi_install.ScriptLocation.field_2._8_8_);
  if (bVar1) {
    CxxModuleBmiInstall::CxxModuleBmiInstall((CxxModuleBmiInstall *)local_2a0);
    pVVar3 = Json::Value::operator[]((Value *)bmi_install.ScriptLocation.field_2._8_8_,"component");
    Json::Value::asString_abi_cxx11_(&local_2c0,pVVar3);
    std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    pVVar3 = Json::Value::operator[]
                       ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"destination");
    Json::Value::asString_abi_cxx11_(&local_2e0,pVVar3);
    std::__cxx11::string::operator=
              ((string *)(bmi_install.Component.field_2._M_local_buf + 8),(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    pVVar3 = Json::Value::operator[]
                       ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"exclude-from-all");
    bmi_install.Destination.field_2._M_local_buf[8] = Json::Value::asBool(pVVar3);
    pVVar3 = Json::Value::operator[]((Value *)bmi_install.ScriptLocation.field_2._8_8_,"optional");
    bmi_install.Destination.field_2._M_local_buf[9] = Json::Value::asBool(pVVar3);
    pVVar3 = Json::Value::operator[]
                       ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"permissions");
    Json::Value::asString_abi_cxx11_(&local_300,pVVar3);
    std::__cxx11::string::operator=((string *)&bmi_install.ExcludeFromAll,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    pVVar3 = Json::Value::operator[]
                       ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"message-level");
    Json::Value::asString_abi_cxx11_(&local_320,pVVar3);
    std::__cxx11::string::operator=
              ((string *)(bmi_install.Permissions.field_2._M_local_buf + 8),(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    pVVar3 = Json::Value::operator[]
                       ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"script-location");
    Json::Value::asString_abi_cxx11_((String *)&tdi_cxx_modules,pVVar3);
    std::__cxx11::string::operator=
              ((string *)(bmi_install.MessageLevel.field_2._M_local_buf + 8),
               (string *)&tdi_cxx_modules);
    std::__cxx11::string::~string((string *)&tdi_cxx_modules);
    pcVar4 = std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
                       ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
    std::optional<CxxModuleBmiInstall>::operator=
              (&pcVar4->BmiInstallation,(CxxModuleBmiInstall *)local_2a0);
    CxxModuleBmiInstall::~CxxModuleBmiInstall((CxxModuleBmiInstall *)local_2a0);
  }
  i.super_ValueIteratorBase._8_8_ = Json::Value::operator[](local_18,"cxx-modules");
  bVar1 = Json::Value::isObject((Value *)i.super_ValueIteratorBase._8_8_);
  if (bVar1) {
    cVar8 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
    local_368 = (_Base_ptr)cVar8.super_ValueIteratorBase.current_._M_node;
    local_360 = cVar8.super_ValueIteratorBase.isNull_;
    local_358 = (undefined1  [8])local_368;
    i.super_ValueIteratorBase.current_._M_node._0_1_ = local_360;
    while( true ) {
      cVar8 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
      fsi = (CxxModuleFileSet *)cVar8.super_ValueIteratorBase.current_._M_node;
      local_380 = cVar8.super_ValueIteratorBase.isNull_;
      local_378.current_._M_node = (_Base_ptr)fsi;
      local_378.isNull_ = (bool)local_380;
      bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_358,&local_378);
      if (!bVar1) break;
      pcVar4 = std::unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter>::operator->
                         ((unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> *)this);
      Json::ValueIteratorBase::key((Value *)&tdi_cxx_module_info,(ValueIteratorBase *)local_358);
      Json::Value::asString_abi_cxx11_(&local_3b0,(Value *)&tdi_cxx_module_info);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
               ::operator[](&pcVar4->ObjectToFileSet,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      Json::Value::~Value((Value *)&tdi_cxx_module_info);
      local_390 = pmVar6;
      local_3e0 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_358);
      pVVar3 = Json::Value::operator[](local_3e0,"name");
      Json::Value::asString_abi_cxx11_(&local_400,pVVar3);
      std::__cxx11::string::operator=((string *)local_390,(string *)&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      pVVar3 = Json::Value::operator[](local_3e0,"bmi-only");
      bVar1 = Json::Value::asBool(pVVar3);
      local_390->BmiOnly = bVar1;
      pVVar3 = Json::Value::operator[](local_3e0,"relative-directory");
      Json::Value::asString_abi_cxx11_(&local_420,pVVar3);
      std::__cxx11::string::operator=((string *)&local_390->RelativeDirectory,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar7 = (char *)std::__cxx11::string::back();
        if (*pcVar7 != '/') {
          local_441 = '/';
          cmStrCat<std::__cxx11::string&,char>(&local_440,&local_390->RelativeDirectory,&local_441);
          std::__cxx11::string::operator=
                    ((string *)&local_390->RelativeDirectory,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
        }
      }
      pVVar3 = Json::Value::operator[](local_3e0,"source");
      Json::Value::asString_abi_cxx11_(&local_468,pVVar3);
      std::__cxx11::string::operator=((string *)&local_390->SourcePath,(string *)&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      pVVar3 = Json::Value::operator[](local_3e0,"type");
      Json::Value::asString_abi_cxx11_(&local_488,pVVar3);
      std::__cxx11::string::operator=((string *)&local_390->Type,(string *)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      pVVar3 = Json::Value::operator[](local_3e0,"visibility");
      Json::Value::asString_abi_cxx11_((String *)&tdi_fs_dest,pVVar3);
      name = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tdi_fs_dest);
      local_498 = name;
      cVar2 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
      local_390->Visibility = cVar2;
      std::__cxx11::string::~string((string *)&tdi_fs_dest);
      local_4c0 = Json::Value::operator[](local_3e0,"destination");
      bVar1 = Json::Value::isString(local_4c0);
      if (bVar1) {
        Json::Value::asString_abi_cxx11_(&local_4e0,local_4c0);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_390->Destination,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
      }
      Json::ValueConstIterator::operator++((ValueConstIterator *)local_358);
    }
  }
  return (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)
         (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>
cmDyndepCollation::ParseExportInfo(Json::Value const& tdi)
{
  auto export_info =
    std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>(
      new cmCxxModuleExportInfo);

  export_info->Config = tdi["config"].asString();
  if (export_info->Config.empty()) {
    export_info->Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info->Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info->BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info->ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.BmiOnly = tdi_cxx_module_info["bmi-only"].asBool();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      if (!fsi.RelativeDirectory.empty() &&
          fsi.RelativeDirectory.back() != '/') {
        fsi.RelativeDirectory = cmStrCat(fsi.RelativeDirectory, '/');
      }
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  return export_info;
}